

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckBlock
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double x;
  double y;
  double __x;
  uint uVar1;
  AActor *origin;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  AActor *thing;
  AActor *pAVar7;
  char *pcVar8;
  uint uVar9;
  bool bVar10;
  double __x_00;
  double dVar11;
  double x_00;
  double y_00;
  double z;
  DVector2 v;
  DVector2 local_40;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_003e18ed:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1992,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003e18ed;
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if (origin != (AActor *)0x0) {
    if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar4 = (origin->super_DThinker).super_DObject.Class;
    bVar10 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar10) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar10 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e18ed;
    }
  }
  if (numparam == 1) {
    pVVar5 = defaultparam->Array;
    if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e192b:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1993,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    pVVar5 = param;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e192b;
    }
  }
  uVar1 = pVVar5[1].field_0.i;
  if (numparam < 3) {
    pVVar5 = defaultparam->Array;
    if (pVVar5[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e194a;
    }
  }
  else {
    pVVar5 = param;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003e194a:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1994,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  if (numparam < 4) {
    pVVar6 = defaultparam->Array;
    if (pVVar6[3].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e1969;
    }
  }
  else {
    pVVar6 = param;
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e1969:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1995,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  x_00 = pVVar6[3].field_0.f;
  if (numparam < 5) {
    pVVar6 = defaultparam->Array;
    if (pVVar6[4].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e1988;
    }
  }
  else {
    pVVar6 = param;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e1988:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1996,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  y_00 = pVVar6[4].field_0.f;
  if (numparam < 6) {
    pVVar6 = defaultparam->Array;
    if (pVVar6[5].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e19a7;
    }
  }
  else {
    pVVar6 = param;
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e19a7:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1997,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  z = pVVar6[5].field_0.f;
  if (numparam < 7) {
    if (defaultparam->Array[6].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e19c6;
    }
  }
  else if (param[6].field_0.field_3.Type != '\x01') {
    pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e19c6:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1998,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  thing = COPY_AAPTR(origin,pVVar5[2].field_0.i);
  if (thing == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x199f,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    x = (thing->__Pos).X;
    y = (thing->__Pos).Y;
    __x = (thing->__Pos).Z;
    if (-1 < (char)uVar1) {
      __x_00 = FFastTrig::sin(&fasttrig,__x);
      dVar11 = FFastTrig::cos(&fasttrig,__x_00);
      P_GetOffsetPosition((thing->__Pos).X,(thing->__Pos).Y,y_00 * __x_00 + x_00 * dVar11,
                          x_00 * __x_00 - y_00 * dVar11);
      z = z + (thing->__Pos).Z;
      x_00 = local_40.X;
      y_00 = local_40.Y;
    }
    if ((uVar1 & 0x20) == 0) {
      AActor::SetOrigin(thing,x_00,y_00,z,true);
      bVar10 = P_TestMobjLocation(thing);
      AActor::SetOrigin(thing,x,y,__x,true);
    }
    else {
      (thing->__Pos).Z = z;
      local_40.X = x_00;
      local_40.Y = y_00;
      bVar10 = P_CheckMove(thing,&local_40,((uVar1 & 0x40) >> 5) + (uVar1 & 1) * 4 + 1);
      (thing->__Pos).Z = __x;
    }
    if (bVar10 == false) {
      if (thing->BlockingMobj != (AActor *)0x0) {
        pAVar7 = thing;
        if ((uVar1 & 0x10) == 0) {
          pAVar7 = origin;
        }
        if (pAVar7 != (AActor *)0x0) {
          if ((uVar1 & 2) != 0) {
            (pAVar7->target).field_0.p = thing->BlockingMobj;
          }
          if ((uVar1 & 4) != 0) {
            (pAVar7->master).field_0 =
                 (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)thing->BlockingMobj;
          }
          if ((uVar1 & 8) != 0) {
            (pAVar7->tracer).field_0 =
                 (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)thing->BlockingMobj;
          }
        }
      }
      if ((((uVar1 & 0x40) != 0) || (uVar9 = 1, thing->BlockingMobj == (AActor *)0x0)) &&
         (((uVar1 & 1) != 0 || (uVar9 = 1, thing->BlockingLine == (line_t *)0x0)))) {
        uVar9 = (uVar1 & 0x20) >> 5;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x19e4,
                      "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (ret->RegType != '\0') goto LAB_003e1905;
      goto LAB_003e18b7;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x19d1,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  if (ret->RegType != '\0') {
LAB_003e1905:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  uVar9 = 0;
LAB_003e18b7:
  *(uint *)ret->Location = uVar9;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckBlock)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags)	
	PARAM_INT_DEF(ptr)		
	PARAM_FLOAT_DEF(xofs)	
	PARAM_FLOAT_DEF(yofs)	
	PARAM_FLOAT_DEF(zofs)	
	PARAM_ANGLE_DEF(angle)	

	AActor *mobj = COPY_AAPTR(self, ptr);

	//Needs at least one state jump to work. 
	if (!mobj)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (!(flags & CBF_ABSOLUTEANGLE))
	{
		angle += self->Angles.Yaw;
	}

	DVector3 oldpos = mobj->Pos();
	DVector3 pos;

	if (flags & CBF_ABSOLUTEPOS)
	{
		pos = { xofs, yofs, zofs };
	}
	else
	{
		double s = angle.Sin();
		double c = angle.Cos();
		pos = mobj->Vec3Offset(xofs * c + yofs * s, xofs * s - yofs * c, zofs);
	}
	
	// Next, try checking the position based on the sensitivity desired.
	// If checking for dropoffs, set the z so we can have maximum flexibility.
	// Otherwise, set origin and set it back after testing.

	bool checker = false;
	if (flags & CBF_DROPOFF)
	{
		// Unfortunately, whenever P_CheckMove returned false, that means it could
		// ignore a variety of flags mainly because of P_CheckPosition. This
		// results in picking up false positives due to actors or lines being in the way
		// when they clearly should not be.

		int fpass = PCM_DROPOFF;
		if (flags & CBF_NOACTORS)	fpass |= PCM_NOACTORS;
		if (flags & CBF_NOLINES)	fpass |= PCM_NOLINES;
		mobj->SetZ(pos.Z);
		checker = P_CheckMove(mobj, pos, fpass);
		mobj->SetZ(oldpos.Z);
	}
	else
	{
		mobj->SetOrigin(pos, true);
		checker = P_TestMobjLocation(mobj);
		mobj->SetOrigin(oldpos, true);
	}
	
	if (checker)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (mobj->BlockingMobj)
	{
		AActor *setter = (flags & CBF_SETONPTR) ? mobj : self;
		if (setter)
		{
			if (flags & CBF_SETTARGET)	setter->target = mobj->BlockingMobj;
			if (flags & CBF_SETMASTER)	setter->master = mobj->BlockingMobj;
			if (flags & CBF_SETTRACER)	setter->tracer = mobj->BlockingMobj;
		}
	}

	//[MC] I don't know why I let myself be persuaded not to include a flag.
	//If an actor is loaded with pointers, they don't really have any options to spare.
	//Also, fail if a dropoff or a step is too great to pass over when checking for dropoffs.
	
	ACTION_RETURN_BOOL((!(flags & CBF_NOACTORS) && (mobj->BlockingMobj)) || (!(flags & CBF_NOLINES) && mobj->BlockingLine != NULL) ||
		((flags & CBF_DROPOFF) && !checker));
}